

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O2

void __thiscall SourceDependChildren::addChild(SourceDependChildren *this,SourceFile *s)

{
  int iVar1;
  SourceFile **__ptr;
  int iVar2;
  
  iVar1 = this->num_nodes;
  iVar2 = this->used_nodes;
  __ptr = this->children;
  if (iVar1 <= iVar2) {
    this->num_nodes = iVar1 + 200;
    __ptr = (SourceFile **)realloc(__ptr,(long)iVar1 * 8 + 0x640);
    this->children = __ptr;
    iVar2 = this->used_nodes;
  }
  this->used_nodes = iVar2 + 1;
  __ptr[iVar2] = s;
  return;
}

Assistant:

void addChild(SourceFile *s) {
        if(num_nodes <= used_nodes) {
            num_nodes += 200;
            children = (SourceFile**)realloc(children, sizeof(SourceFile*)*(num_nodes));
        }
        children[used_nodes++] = s;
    }